

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datumtest.cpp
# Opt level: O0

int testDatumPushPopString(void)

{
  int iVar1;
  VRString h;
  VRString g;
  VRDatumString a;
  VRString f;
  int loopctr;
  int out;
  VRDatumSpecialized<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(MinVR::VRCORETYPE_ID)3>
  *in_stack_fffffffffffffe98;
  VRDatumConverter<MinVR::VRDatum> in_stack_fffffffffffffea0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *inVal;
  VRDatumConverter<MinVR::VRDatum> in_stack_fffffffffffffec0;
  string local_138 [8];
  allocator<char> *in_stack_fffffffffffffed0;
  VRString *in_stack_fffffffffffffed8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee0;
  string local_110 [39];
  allocator<char> local_e9;
  string local_e8 [32];
  string local_c8 [32];
  VRDatumSpecialized<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(MinVR::VRCORETYPE_ID)3>
  local_a8;
  undefined1 local_29 [33];
  int local_8;
  int local_4;
  
  local_4 = 0;
  for (local_8 = 0; local_8 < 10; local_8 = local_8 + 1) {
    inVal = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_29;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffee0,(char *)in_stack_fffffffffffffed8,in_stack_fffffffffffffed0
              );
    std::allocator<char>::~allocator((allocator<char> *)local_29);
    std::__cxx11::string::string(local_c8,(string *)(local_29 + 1));
    MinVR::VRDatumString::VRDatumString
              ((VRDatumString *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    std::__cxx11::string::~string(local_c8);
    MinVR::
    VRDatumSpecialized<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(MinVR::VRCORETYPE_ID)3>
    ::push(&local_a8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffee0,(char *)in_stack_fffffffffffffed8,in_stack_fffffffffffffed0
              );
    MinVR::
    VRDatumSpecialized<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(MinVR::VRCORETYPE_ID)3>
    ::setValue((VRDatumSpecialized<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(MinVR::VRCORETYPE_ID)3>
                *)in_stack_fffffffffffffec0.datum,inVal);
    std::__cxx11::string::~string(local_e8);
    std::allocator<char>::~allocator(&local_e9);
    MinVR::
    VRDatumSpecialized<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(MinVR::VRCORETYPE_ID)3>
    ::getValue(in_stack_fffffffffffffe98);
    MinVR::VRDatumConverter::operator_cast_to_string
              ((VRDatumConverter<MinVR::VRDatum> *)in_stack_fffffffffffffe98);
    iVar1 = std::__cxx11::string::compare((char *)local_110);
    local_4 = local_4 + iVar1;
    MinVR::
    VRDatumSpecialized<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(MinVR::VRCORETYPE_ID)3>
    ::pop((VRDatumSpecialized<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(MinVR::VRCORETYPE_ID)3>
           *)in_stack_fffffffffffffea0.datum);
    in_stack_fffffffffffffea0 =
         MinVR::
         VRDatumSpecialized<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(MinVR::VRCORETYPE_ID)3>
         ::getValue(in_stack_fffffffffffffe98);
    in_stack_fffffffffffffec0 = in_stack_fffffffffffffea0;
    MinVR::VRDatumConverter::operator_cast_to_string
              ((VRDatumConverter<MinVR::VRDatum> *)in_stack_fffffffffffffe98);
    iVar1 = std::__cxx11::string::compare((char *)local_138);
    local_4 = iVar1 + local_4;
    std::__cxx11::string::~string(local_138);
    std::__cxx11::string::~string(local_110);
    MinVR::VRDatumString::~VRDatumString((VRDatumString *)0x10ca97);
    std::__cxx11::string::~string((string *)(local_29 + 1));
  }
  return local_4;
}

Assistant:

int testDatumPushPopString() {

  int out = 0;

  LOOP {

    MinVR::VRString f = "hello";
    MinVR::VRDatumString a = MinVR::VRDatumString(f);

    a.push();
    a.setValue("good-bye");
    MinVR::VRString g = a.getValue();
    out += g.compare("good-bye");

    a.pop();
    MinVR::VRString h = a.getValue();
    out += h.compare("hello");
  }